

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O3

void __thiscall
qclab::qgates::Hadamard<std::complex<double>_>::Hadamard(Hadamard<std::complex<double>_> *this)

{
  (this->super_QGate1<std::complex<double>_>).qubit_ = 0;
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0018c5d0;
  return;
}

Assistant:

QGate1()
        : qubit_( 0 )
        { }